

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O1

void Abc_TruthReadHex(word *pTruth,char *pString,int nVars)

{
  char cVar1;
  uint uVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  
  uVar2 = 0x10 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar2 = 1 << ((char)nVars - 2U & 0x1f);
  }
  if (*pString == '0') {
    pString = pString + (ulong)(pString[1] == 'x') * 2;
  }
  if (((ulong)(byte)pString[(int)uVar2] < 0x21) &&
     ((0x100002401U >> ((ulong)(byte)pString[(int)uVar2] & 0x3f) & 1) != 0)) {
    if (0 < (int)uVar2) {
      bVar3 = 0;
      uVar4 = 0;
      do {
        pString = pString + -1;
        cVar1 = pString[uVar2];
        iVar5 = -0x30;
        if (((9 < (byte)(cVar1 - 0x30U)) && (iVar5 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) &&
           (iVar5 = -0x57, 5 < (byte)(cVar1 + 0x9fU))) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDec.c"
                        ,0x4d,"int Abc_TruthReadHexDigit(char)");
        }
        pTruth[uVar4 >> 4 & 0xfffffff] =
             pTruth[uVar4 >> 4 & 0xfffffff] | (ulong)(uint)(iVar5 + cVar1) << (bVar3 & 0x3c);
        uVar4 = uVar4 + 1;
        bVar3 = bVar3 + 4;
      } while (uVar2 != uVar4);
    }
    return;
  }
  __assert_fail("EndSymbol == \' \' || EndSymbol == \'\\n\' || EndSymbol == \'\\r\' || EndSymbol == \'\\0\'"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDec.c"
                ,0x69,"void Abc_TruthReadHex(word *, char *, int)");
}

Assistant:

void Abc_TruthReadHex( word * pTruth, char * pString, int nVars )
{
    int nWords = (nVars < 7)? 1 : (1 << (nVars-6));
    int k, Digit, nDigits = (nVars < 7) ? (1 << (nVars-2)) : (nWords << 4);
    char EndSymbol;
    // skip the first 2 symbols if they are "0x"
    if ( pString[0] == '0' && pString[1] == 'x' )
        pString += 2;
    // get the last symbol
    EndSymbol = pString[nDigits];
    // the end symbol of the TT (the one immediately following hex digits)
    // should be one of the following: space, a new-line, or a zero-terminator
    // (note that on Windows symbols '\r' can be inserted before each '\n')
    assert( EndSymbol == ' ' || EndSymbol == '\n' || EndSymbol == '\r' || EndSymbol == '\0' );
    // read hexadecimal digits in the reverse order
    // (the last symbol in the string is the least significant digit)
    for ( k = 0; k < nDigits; k++ )
    {
        Digit = Abc_TruthReadHexDigit( pString[nDigits - 1 - k] );
        assert( Digit >= 0 && Digit < 16 );
        Abc_TruthSetHex( pTruth, k, Digit );
    }
}